

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::ECCurveTest_Compare_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::ECCurveTest_Compare_Test> *this)

{
  Test *this_00;
  ParameterizedTestFactory<(anonymous_namespace)::ECCurveTest_Compare_Test> *this_local;
  
  WithParamInterface<int>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x20);
  anon_unknown.dwarf_263068::ECCurveTest_Compare_Test::ECCurveTest_Compare_Test
            ((ECCurveTest_Compare_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }